

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_mstring_get_mbs(archive_conflict *a,archive_mstring *aes,char **p)

{
  wchar_t wVar1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  wchar_t ret;
  wchar_t r;
  wchar_t local_28;
  wchar_t local_4;
  
  local_28 = L'\0';
  if ((*(uint *)(in_RSI + 0xc) & 1) == 0) {
    *in_RDX = 0;
    if ((*(uint *)(in_RSI + 0xc) & 4) != 0) {
      in_RSI[1] = 0;
      wVar1 = archive_string_append_from_wcs((archive_string *)a,(wchar_t *)aes,(size_t)p);
      *in_RDX = *in_RSI;
      if (wVar1 == L'\0') {
        *(uint *)(in_RSI + 0xc) = *(uint *)(in_RSI + 0xc) | 1;
        return L'\0';
      }
      local_28 = L'\xffffffff';
    }
    local_4 = local_28;
  }
  else {
    *in_RDX = *in_RSI;
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

int
archive_mstring_get_mbs(struct archive *a, struct archive_mstring *aes,
    const char **p)
{
	int r, ret = 0;

	(void)a; /* UNUSED */
	/* If we already have an MBS form, return that immediately. */
	if (aes->aes_set & AES_SET_MBS) {
		*p = aes->aes_mbs.s;
		return (ret);
	}

	*p = NULL;
	/* If there's a WCS form, try converting with the native locale. */
	if (aes->aes_set & AES_SET_WCS) {
		archive_string_empty(&(aes->aes_mbs));
		r = archive_string_append_from_wcs(&(aes->aes_mbs),
		    aes->aes_wcs.s, aes->aes_wcs.length);
		*p = aes->aes_mbs.s;
		if (r == 0) {
			aes->aes_set |= AES_SET_MBS;
			return (ret);
		} else
			ret = -1;
	}

	/*
	 * Only a UTF-8 form cannot avail because its conversion already
	 * failed at archive_mstring_update_utf8().
	 */
	return (ret);
}